

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O0

TYPE __thiscall
duckdb::RangeInfoStruct<duckdb::TimestampRangeInfo,_true>::EndListValue
          (RangeInfoStruct<duckdb::TimestampRangeInfo,_true> *this,idx_t row_idx)

{
  long lVar1;
  idx_t iVar2;
  idx_t in_RSI;
  long in_RDI;
  idx_t idx;
  TYPE *data;
  idx_t vdata_idx;
  
  iVar2 = DataChunk::ColumnCount((DataChunk *)0xd9710f);
  lVar1 = *(long *)(in_RDI + (long)(int)(uint)(iVar2 != 1) * 0x48 + 0x10);
  iVar2 = SelectionVector::get_index
                    (*(SelectionVector **)(in_RDI + 8 + (long)(int)(uint)(iVar2 != 1) * 0x48),in_RSI
                    );
  return (TYPE)*(int64_t *)(lVar1 + iVar2 * 8);
}

Assistant:

typename OP::TYPE EndListValue(idx_t row_idx) {
		idx_t vdata_idx = args.ColumnCount() == 1 ? 0 : 1;
		auto data = (typename OP::TYPE *)vdata[vdata_idx].data;
		auto idx = vdata[vdata_idx].sel->get_index(row_idx);
		return data[idx];
	}